

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::Texture2DShadowCase::iterate(Texture2DShadowCase *this)

{
  Vec2 *vec;
  Vec2 *vec_00;
  ostringstream *poVar1;
  TestLog *log;
  RenderContext *context;
  pointer pFVar2;
  pointer pFVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  CompareMode CVar8;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  NotSupportedError *this_00;
  char *description;
  TestContext *pTVar11;
  qpTestResult testResult;
  allocator<char> local_311;
  pointer local_310;
  RandomViewport viewport;
  LodPrecision local_2f4;
  vector<float,_std::allocator<float>_> texCoord;
  ScopedLogSection section;
  Surface rendered;
  undefined1 local_298 [32];
  int local_278;
  PixelFormat pixelFormat;
  undefined1 local_248 [76];
  size_type sStack_1fc;
  size_type local_1f4;
  bool bStack_1ec;
  undefined3 uStack_1eb;
  CompareMode CStack_1e8;
  int local_1e4;
  anon_union_16_3_1194ccdc_for_v local_1e0;
  undefined8 local_1d0;
  LodMode local_1c8;
  undefined1 local_1b0 [32];
  int local_190;
  anon_union_16_3_1194ccdc_for_v local_18c [21];
  long lVar9;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  dVar7 = deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,pRVar10,0x40,0x40,dVar6 ^ dVar7);
  local_310 = (this->m_cases).
              super__Vector_base<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,"Test",(allocator<char> *)&local_2f4);
  de::toString<int>((string *)local_298,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
  std::__cxx11::string::string<std::allocator<char>>((string *)&texCoord,"Test ",&local_311);
  de::toString<int>((string *)&pixelFormat,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rendered,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texCoord,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixelFormat);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1b0,(string *)&rendered);
  std::__cxx11::string::~string((string *)&rendered);
  std::__cxx11::string::~string((string *)&pixelFormat);
  std::__cxx11::string::~string((string *)&texCoord);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::~string((string *)local_248);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_248,TEXTURETYPE_2D);
  tcu::Surface::Surface(&rendered,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if ((viewport.width < 0x40) || (viewport.height < 0x40)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
               ,0x150);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1b0,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                    this->m_magFilter);
  local_1e4 = local_190;
  local_1f4 = local_1b0._16_8_;
  bStack_1ec = (bool)local_1b0[0x18];
  uStack_1eb = local_1b0._25_3_;
  CStack_1e8 = local_1b0._28_4_;
  local_248._68_8_ = local_1b0._0_8_;
  sStack_1fc = local_1b0._8_8_;
  local_1e0._0_8_ = local_18c[0]._0_8_;
  local_1e0._8_8_ = local_18c[0]._8_8_;
  local_1d0 = local_18c[1]._0_8_;
  CVar8 = glu::mapGLCompareFunc(this->m_compareFunc);
  CStack_1e8 = CVar8;
  local_248._4_4_ = SAMPLERTYPE_SHADOW;
  local_1c8 = LODMODE_EXACT;
  local_248._32_4_ = local_310->ref;
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Compare reference value =  ");
  std::ostream::operator<<(poVar1,(float)local_248._32_4_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Texture coordinates: ");
  vec = &local_310->minCoord;
  tcu::operator<<((ostream *)poVar1,vec);
  std::operator<<((ostream *)poVar1," -> ");
  vec_00 = &local_310->maxCoord;
  tcu::operator<<((ostream *)poVar1,vec_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,vec,vec_00);
  (**(code **)(lVar9 + 0xb8))(0xde1,local_310->texture->m_glTexture);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2800,this->m_magFilter);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x884c,0x884e);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x884d,this->m_compareFunc);
  (**(code **)(lVar9 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(RenderParams *)local_248);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&rendered);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1b0);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  pixelFormat.redBits = (pRVar10->m_pixelFormat).redBits;
  pixelFormat.greenBits = (pRVar10->m_pixelFormat).greenBits;
  pixelFormat.blueBits = (pRVar10->m_pixelFormat).blueBits;
  pixelFormat.alphaBits = (pRVar10->m_pixelFormat).alphaBits;
  local_2f4.rule = RULE_OPENGL;
  tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_298);
  local_2f4.derivateBits = 0x12;
  local_2f4.lodBits = 6;
  local_298._0_8_ = (pointer)0x1400000014;
  local_298._8_4_ = 0;
  local_298._12_4_ = 7;
  local_298._16_4_ = 7;
  local_298._20_4_ = 0;
  local_298._24_4_ = 5;
  local_298._28_4_ = 0x10;
  local_278 = pixelFormat.redBits + -1;
  pTVar11 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&rendered);
  bVar4 = verifyTexCompareResult<tcu::Texture2D>
                    (pTVar11,(ConstPixelBufferAccess *)local_1b0,&local_310->texture->m_refTexture,
                     texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(ReferenceParams *)local_248,
                     (TexComparePrecision *)local_298,&local_2f4,&pixelFormat);
  if (!bVar4) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Warning: Verification assuming high-quality PCF filtering failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    local_2f4.lodBits = 4;
    local_298._12_4_ = 4;
    local_298._16_4_ = 4;
    local_298._20_4_ = 0;
    local_298._24_4_ = 0;
    pTVar11 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&rendered);
    bVar4 = verifyTexCompareResult<tcu::Texture2D>
                      (pTVar11,(ConstPixelBufferAccess *)local_1b0,&local_310->texture->m_refTexture
                       ,texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ReferenceParams *)local_248,
                       (TexComparePrecision *)local_298,&local_2f4,&pixelFormat);
    if (bVar4) {
      pTVar11 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (pTVar11->m_testResult != QP_TEST_RESULT_PASS) goto LAB_0057e5fa;
      description = "Low-quality result";
      testResult = QP_TEST_RESULT_QUALITY_WARNING;
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "ERROR: Verification against low precision requirements failed, failing test case."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar11 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(pTVar11,testResult,description);
  }
LAB_0057e5fa:
  iVar5 = this->m_caseNdx + 1;
  this->m_caseNdx = iVar5;
  pFVar2 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar3 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&rendered);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return (IterateResult)(iVar5 < (int)((ulong)((long)pFVar2 - (long)pFVar3) >> 5));
}

Assistant:

Texture2DShadowCase::IterateResult Texture2DShadowCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	const RandomViewport			viewport		(m_context.getRenderTarget(), TEX2D_VIEWPORT_WIDTH, TEX2D_VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					sampleParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered		(viewport.width, viewport.height);
	vector<float>					texCoord;

	if (viewport.width < TEX2D_MIN_VIEWPORT_WIDTH || viewport.height < TEX2D_MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small render target", "", __FILE__, __LINE__);

	// Setup params for reference.
	sampleParams.sampler			= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	sampleParams.sampler.compare	= glu::mapGLCompareFunc(m_compareFunc);
	sampleParams.samplerType		= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode			= LODMODE_EXACT;
	sampleParams.ref				= curCase.ref;

	m_testCtx.getLog() << TestLog::Message << "Compare reference value =  " << sampleParams.ref << TestLog::EndMessage;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Texture coordinates: " << curCase.minCoord << " -> " << curCase.maxCoord << TestLog::EndMessage;
	computeQuadTexCoord2D(texCoord, curCase.minCoord, curCase.maxCoord);

	gl.bindTexture	(GL_TEXTURE_2D, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,		m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,		m_magFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,			m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,			m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE,	GL_COMPARE_REF_TO_TEXTURE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC,	m_compareFunc);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, &texCoord[0], sampleParams);
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, rendered.getAccess());

	{
		const tcu::PixelFormat		pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		tcu::LodPrecision			lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::TexComparePrecision	texComparePrecision;

		lodPrecision.derivateBits			= 18;
		lodPrecision.lodBits				= 6;
		texComparePrecision.coordBits		= tcu::IVec3(20,20,0);
		texComparePrecision.uvwBits			= tcu::IVec3(7,7,0);
		texComparePrecision.pcfBits			= 5;
		texComparePrecision.referenceBits	= 16;
		texComparePrecision.resultBits		= pixelFormat.redBits-1;

		const bool isHighQuality = verifyTexCompareResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
														  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			m_testCtx.getLog() << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

			lodPrecision.lodBits			= 4;
			texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
			texComparePrecision.pcfBits		= 0;

			const bool isOk = verifyTexCompareResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
													 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
			}
			else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality result");
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}